

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

Maybe<float> __thiscall kj::StringPtr::tryParseAs<float>(StringPtr *this)

{
  StringPtr *in_RSI;
  _ local_20 [8];
  double local_18;
  
  _::tryParseDouble(local_20,in_RSI);
  *(undefined1 *)&(this->content).ptr = 0;
  if (local_20[0] == (_)0x1) {
    *(float *)((long)&(this->content).ptr + 4) = (float)local_18;
    *(undefined1 *)&(this->content).ptr = 1;
  }
  return (Maybe<float>)(NullableValue<float>)this;
}

Assistant:

Maybe<double> StringPtr::tryParseAs<double>() const { return _::tryParseDouble(*this); }